

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

MixingHashState
absl::lts_20240722::hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>
::combine<google::protobuf::Message_const*,std::__cxx11::string>
          (MixingHashState state,Message **value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values)

{
  enable_if_t<std::is_same<MixingHashState,_decltype(AbslHashValue(std::move(state),_value))>::value,_absl::lts_20240722::hash_internal::MixingHashState>
  eVar1;
  
  eVar1 = HashSelect::HashValueProbe::
          Invoke<absl::lts_20240722::hash_internal::MixingHashState,google::protobuf::Message_const*>
                    (state,value);
  eVar1 = HashSelect::HashValueProbe::
          Invoke<absl::lts_20240722::hash_internal::MixingHashState,std::__cxx11::string>
                    (eVar1.state_,values);
  return (MixingHashState)eVar1.state_;
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}